

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes128.c
# Opt level: O1

int aead_aes128gcm_setup_crypto(ptls_aead_context_t *ctx,int is_enc,void *key,void *iv)

{
  int iVar1;
  EVP_CIPHER *cipher;
  
  cipher = EVP_aes_128_gcm();
  iVar1 = aead_setup_crypto(ctx,is_enc,key,iv,(EVP_CIPHER *)cipher);
  return iVar1;
}

Assistant:

static int aead_aes128gcm_setup_crypto(ptls_aead_context_t *ctx, int is_enc, const void *key, const void *iv)
{
    return aead_aesgcm_setup_crypto(ctx, is_enc, key, iv);
}